

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

ListSegment *
duckdb::GetSegment(ListSegmentFunctions *functions,ArenaAllocator *allocator,LinkedList *linked_list
                  )

{
  uint16_t uVar1;
  ListSegment *pLVar2;
  LinkedList *pLVar3;
  
  pLVar2 = linked_list->last_segment;
  if (pLVar2 == (ListSegment *)0x0) {
    pLVar2 = (*functions->create_segment)(functions,allocator,functions->initial_capacity);
    pLVar3 = linked_list;
  }
  else {
    uVar1 = pLVar2->capacity;
    if (uVar1 != pLVar2->count) {
      return pLVar2;
    }
    pLVar2 = (*functions->create_segment)(functions,allocator,uVar1 << (-1 < (short)uVar1));
    pLVar3 = (LinkedList *)linked_list->last_segment;
  }
  pLVar3->first_segment = pLVar2;
  linked_list->last_segment = pLVar2;
  return pLVar2;
}

Assistant:

static ListSegment *GetSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                               LinkedList &linked_list) {
	ListSegment *segment;

	// determine segment
	if (!linked_list.last_segment) {
		// empty linked list, create the first (and last) segment
		segment = functions.create_segment(functions, allocator, functions.initial_capacity);
		linked_list.first_segment = segment;
		linked_list.last_segment = segment;
	} else if (linked_list.last_segment->capacity == linked_list.last_segment->count) {
		// the last segment of the linked list is full, create a new one and append it
		auto capacity = GetCapacityForNewSegment(linked_list.last_segment->capacity);
		segment = functions.create_segment(functions, allocator, capacity);
		linked_list.last_segment->next = segment;
		linked_list.last_segment = segment;
	} else {
		// the last segment of the linked list is not full, append the data to it
		segment = linked_list.last_segment;
	}

	D_ASSERT(segment);
	return segment;
}